

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Data_R_PDU::Encode(Data_R_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  pointer pKVar4;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  KDataStream::Write<unsigned_int>(stream,(this->super_Data_PDU).m_ui32RequestID);
  Reliability_Header::Encode(&this->super_Reliability_Header,stream);
  KDataStream::Write<unsigned_int>
            (stream,(this->super_Data_PDU).super_Comment_PDU.m_ui32NumFixedDatum);
  KDataStream::Write<unsigned_int>
            (stream,(this->super_Data_PDU).super_Comment_PDU.m_ui32NumVariableDatum);
  pKVar1 = (this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar3 = (this->super_Data_PDU).super_Comment_PDU.m_vFixedDatum.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar3 != pKVar1; pKVar3 = pKVar3 + 1) {
    (*(pKVar3->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar3->m_pRef,stream);
  }
  pKVar2 = (this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->super_Data_PDU).super_Comment_PDU.m_vVariableDatum.
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar4->m_pRef,stream);
  }
  return;
}

Assistant:

void Data_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RequestID;

    Reliability_Header::Encode( stream );

    stream << m_ui32NumFixedDatum
           << m_ui32NumVariableDatum;

    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ( *citrFixed )->Encode( stream );
    }

    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ( *citrVar )->Encode( stream );
    }
}